

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OperatorExpressions.cpp
# Opt level: O1

Expression *
slang::ast::StreamingConcatenationExpression::fromSyntax
          (Compilation *comp,StreamingConcatenationExpressionSyntax *syntax,ASTContext *context)

{
  TokenKind TVar1;
  underlying_type uVar2;
  variant_alternative_t<1UL,_variant<Token,_const_SyntaxNode_*>_> pSVar3;
  undefined1 auVar4 [16];
  SourceRange sourceRange;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  bool bVar8;
  int iVar9;
  int iVar10;
  SourceLocation SVar11;
  StreamingConcatenationExpression *pSVar12;
  undefined4 extraout_var;
  variant_alternative_t<1UL,_variant<Token,_const_SyntaxNode_*>_> *ppSVar13;
  Scope *this_00;
  Type *pTVar14;
  uint64_t uVar15;
  SymbolMap *pSVar16;
  Diagnostic *pDVar17;
  undefined4 extraout_var_00;
  Type *pTVar18;
  optional<int> value;
  int iVar19;
  ASTContext *extraout_RDX;
  ASTContext *extraout_RDX_00;
  ASTContext *extraout_RDX_01;
  ASTContext *extraout_RDX_02;
  ASTContext *extraout_RDX_03;
  ASTContext *extraout_RDX_04;
  ASTContext *extraout_RDX_05;
  ASTContext *extraout_RDX_06;
  ASTContext *extraout_RDX_07;
  ASTContext *extraout_RDX_08;
  Type *extraout_RDX_09;
  ASTContext *extraout_RDX_10;
  ASTContext *extraout_RDX_11;
  ASTContext *extraout_RDX_12;
  long lVar20;
  SourceLocation in_R8;
  StreamingConcatenationExpression *unaff_R14;
  ulong uVar21;
  byte bVar22;
  SourceRange SVar23;
  SourceRange assignmentRange;
  optional<slang::ConstantRange> oVar24;
  uint64_t sliceSize;
  uint64_t bitstreamWidth;
  SmallVector<slang::ast::StreamingConcatenationExpression::StreamExpression,_4UL> buffer;
  EvalContext evalCtx;
  Compilation *pCVar25;
  uint local_464;
  StreamingConcatenationExpressionSyntax *local_460;
  unsigned_long local_458;
  StreamingConcatenationExpression *local_450;
  byte local_441;
  undefined1 local_440 [16];
  Type *local_430;
  StreamingConcatenationExpression *local_428;
  uint local_41c;
  char local_418;
  uint7 uStack_417;
  unsigned_long local_410;
  underlying_type local_408;
  SmallVectorBase<slang::ast::StreamingConcatenationExpression::StreamExpression> local_400 [2];
  undefined1 local_388 [8];
  __extent_storage<18446744073709551615UL> _Stack_380;
  bitmask<slang::ast::ASTFlags> local_378;
  Symbol *pSStack_370;
  SourceLocation local_368;
  SourceLocation SStack_360;
  AssertionInstanceDetails *local_358;
  undefined1 local_350;
  undefined8 local_34c;
  undefined8 uStack_344;
  undefined4 local_33c;
  SmallVectorBase<slang::ast::EvalContext::Frame> local_338;
  undefined1 *local_280;
  undefined8 local_278;
  undefined8 local_270;
  undefined1 local_268 [40];
  SmallVectorBase<slang::Diagnostic> local_240;
  SmallVectorBase<slang::Diagnostic> local_148;
  undefined8 local_50;
  undefined8 uStack_48;
  undefined1 local_40;
  Expression *this;
  
  uVar2 = (context->flags).m_bits;
  TVar1 = (syntax->operatorToken).kind;
  local_458 = 0;
  local_460 = syntax;
  local_450 = (StreamingConcatenationExpression *)context;
  if ((-1 < (char)uVar2) &&
     ((((uint)uVar2 >> 0x14 & 1) != 0 || (((comp->options).flags.m_bits & 0x800) == 0)))) {
    SVar11 = parsing::Token::location(&syntax->operatorToken);
    ASTContext::addDiag((ASTContext *)local_450,(DiagCode)0x2a0007,SVar11);
    pTVar18 = comp->errorType;
    auVar7._12_4_ = 0;
    auVar7._0_12_ = local_440._4_12_;
    local_440 = auVar7 << 0x20;
    local_388 = (undefined1  [8])0x0;
    _Stack_380._M_extent_value = 0;
    local_400[0]._0_16_ =
         (undefined1  [16])slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)syntax);
    pSVar12 = BumpAllocator::
              emplace<slang::ast::StreamingConcatenationExpression,slang::ast::Type_const&,unsigned_long&,unsigned_int,std::span<slang::ast::StreamingConcatenationExpression::StreamExpression_const,18446744073709551615ul>,slang::SourceRange>
                        (&comp->super_BumpAllocator,pTVar18,&local_458,(uint *)local_440,
                         (span<const_slang::ast::StreamingConcatenationExpression::StreamExpression,_18446744073709551615UL>
                          *)local_388,(SourceRange *)local_400);
    pSVar12 = (StreamingConcatenationExpression *)
              Expression::badExpr(comp,&pSVar12->super_Expression);
    return &pSVar12->super_Expression;
  }
  if (syntax->sliceSize == (ExpressionSyntax *)0x0) {
    if (TVar1 == LeftShift) {
      local_458 = 1;
    }
    goto LAB_00439f7a;
  }
  iVar9 = Expression::bind((int)syntax->sliceSize,(sockaddr *)context,4);
  this = (Expression *)CONCAT44(extraout_var,iVar9);
  bVar8 = Expression::bad(this);
  pSVar12 = local_450;
  if (bVar8) {
LAB_00439efc:
    pTVar18 = comp->errorType;
    auVar5._12_4_ = 0;
    auVar5._0_12_ = local_440._4_12_;
    local_440 = auVar5 << 0x20;
    in_R8 = (SourceLocation)local_388;
    local_388 = (undefined1  [8])0x0;
    _Stack_380._M_extent_value = 0;
    pCVar25 = comp;
    local_400[0]._0_16_ =
         (undefined1  [16])slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)local_460);
    pSVar12 = BumpAllocator::
              emplace<slang::ast::StreamingConcatenationExpression,slang::ast::Type_const&,unsigned_long&,unsigned_int,std::span<slang::ast::StreamingConcatenationExpression::StreamExpression_const,18446744073709551615ul>,slang::SourceRange>
                        (&comp->super_BumpAllocator,pTVar18,&local_458,(uint *)local_440,
                         (span<const_slang::ast::StreamingConcatenationExpression::StreamExpression,_18446744073709551615UL>
                          *)in_R8,(SourceRange *)local_400);
    pSVar12 = (StreamingConcatenationExpression *)
              Expression::badExpr(comp,&pSVar12->super_Expression);
    context = extraout_RDX;
    comp = pCVar25;
LAB_00439f5f:
    bVar8 = false;
  }
  else {
    if (this->kind != DataType) {
      value = ASTContext::evalInteger
                        ((ASTContext *)local_450,this,(bitmask<slang::ast::EvalFlags>)0x0);
      bVar8 = ASTContext::requireGtZero((ASTContext *)pSVar12,value,this->sourceRange);
      if (bVar8) {
        local_458 = (ulong)value.super__Optional_base<int,_true,_true>._M_payload.
                           super__Optional_payload_base<int> & 0xffffffff;
        context = extraout_RDX_10;
        goto LAB_0043a926;
      }
      pTVar18 = comp->errorType;
      auVar6._12_4_ = 0;
      auVar6._0_12_ = local_440._4_12_;
      local_440 = auVar6 << 0x20;
      in_R8 = (SourceLocation)local_388;
      local_388 = (undefined1  [8])0x0;
      _Stack_380._M_extent_value = 0;
      pCVar25 = comp;
      local_400[0]._0_16_ =
           (undefined1  [16])slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)local_460);
      pSVar12 = BumpAllocator::
                emplace<slang::ast::StreamingConcatenationExpression,slang::ast::Type_const&,unsigned_long&,unsigned_int,std::span<slang::ast::StreamingConcatenationExpression::StreamExpression_const,18446744073709551615ul>,slang::SourceRange>
                          (&comp->super_BumpAllocator,pTVar18,&local_458,(uint *)local_440,
                           (span<const_slang::ast::StreamingConcatenationExpression::StreamExpression,_18446744073709551615UL>
                            *)in_R8,(SourceRange *)local_400);
      pSVar12 = (StreamingConcatenationExpression *)
                Expression::badExpr(comp,&pSVar12->super_Expression);
      context = extraout_RDX_11;
      comp = pCVar25;
      goto LAB_00439f5f;
    }
    bVar8 = Type::isFixedSize((this->type).ptr);
    if (!bVar8) {
      pDVar17 = ASTContext::addDiag((ASTContext *)local_450,(DiagCode)0x2d0007,this->sourceRange);
      SVar11 = (((this->type).ptr)->super_Symbol).location;
      if (((ulong)SVar11 & 0xfffffff) != 0) {
        Diagnostic::addNote(pDVar17,(DiagCode)0x50001,SVar11);
      }
      goto LAB_00439efc;
    }
    local_458 = Type::getBitstreamWidth((this->type).ptr);
    context = extraout_RDX_08;
    pSVar12 = unaff_R14;
LAB_0043a926:
    bVar8 = true;
    if (TVar1 != LeftShift) {
      local_458 = 0;
      SVar23 = slang::syntax::SyntaxNode::sourceRange(&local_460->sliceSize->super_SyntaxNode);
      ASTContext::addDiag((ASTContext *)local_450,(DiagCode)0xc20007,SVar23);
      context = extraout_RDX_12;
    }
  }
  unaff_R14 = pSVar12;
  if (!bVar8) {
    return &pSVar12->super_Expression;
  }
LAB_00439f7a:
  local_410 = 0;
  local_400[0].len = 0;
  local_400[0].data_ = (pointer)((long)local_400 + 0x18);
  local_400[0].cap = 4;
  uVar21 = (local_460->expressions).elements._M_extent._M_extent_value + 1;
  bVar22 = uVar21 < 2;
  local_428 = unaff_R14;
  local_408 = uVar2;
  if (!(bool)bVar22) {
    uVar21 = uVar21 >> 1;
    lVar20 = 0;
    do {
      local_441 = bVar22;
      ppSVar13 = std::get<1ul,slang::parsing::Token,slang::syntax::SyntaxNode_const*>
                           ((variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> *)
                            ((long)&(((local_460->expressions).elements._M_ptr)->
                                    super_ConstTokenOrSyntax).
                                    super_variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                                    .
                                    super__Variant_base<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                                    .
                                    super__Move_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                                    .
                                    super__Copy_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                                    .
                                    super__Move_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                            + lVar20));
      pSVar3 = *ppSVar13;
      this_00 = (Scope *)Expression::selfDetermined
                                   (comp,*(ExpressionSyntax **)(pSVar3 + 1),(ASTContext *)local_450,
                                    (bitmask<slang::ast::ASTFlags>)0x80);
      bVar8 = Expression::bad((Expression *)this_00);
      if (bVar8) {
        pTVar18 = comp->errorType;
        local_464 = 0;
        local_388 = (undefined1  [8])0x0;
        _Stack_380._M_extent_value = 0;
        local_440 = (undefined1  [16])
                    slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)local_460);
        in_R8 = (SourceLocation)local_388;
        pSVar12 = BumpAllocator::
                  emplace<slang::ast::StreamingConcatenationExpression,slang::ast::Type_const&,unsigned_long&,unsigned_int,std::span<slang::ast::StreamingConcatenationExpression::StreamExpression_const,18446744073709551615ul>,slang::SourceRange>
                            (&comp->super_BumpAllocator,pTVar18,&local_458,&local_464,
                             (span<const_slang::ast::StreamingConcatenationExpression::StreamExpression,_18446744073709551615UL>
                              *)local_388,(SourceRange *)local_440);
        local_428 = (StreamingConcatenationExpression *)
                    Expression::badExpr(comp,&pSVar12->super_Expression);
        context = extraout_RDX_00;
LAB_0043a1fe:
        bVar8 = false;
      }
      else {
        pTVar18 = ((not_null<const_slang::ast::Type_*> *)&this_00->thisSym)->ptr;
        if (pSVar3[1].parent != (SyntaxNode *)0x0) {
          bVar8 = Type::isUnpackedArray(pTVar18);
          if (bVar8) {
            if (pTVar18->canonical == (Type *)0x0) {
              Type::resolveCanonical(pTVar18);
            }
            if ((pTVar18->canonical->super_Symbol).kind != AssociativeArrayType) {
              pTVar14 = Type::getArrayElementType(pTVar18);
              bVar8 = Type::isFixedSize(pTVar14);
              if (bVar8) {
                local_430 = (Type *)pSVar3[1].parent[1].previewNode;
                ASTContext::resetFlags
                          ((ASTContext *)local_388,(ASTContext *)local_450,
                           (bitmask<slang::ast::ASTFlags>)0x200000000);
                local_430 = (Type *)Expression::bindSelector
                                              (comp,(Expression *)this_00,
                                               (ElementSelectSyntax *)local_430,
                                               (ASTContext *)local_388);
                bVar8 = Expression::bad((Expression *)local_430);
                if (bVar8) {
                  pTVar18 = comp->errorType;
                  local_464 = 0;
                  local_388 = (undefined1  [8])0x0;
                  _Stack_380._M_extent_value = 0;
                  local_440 = (undefined1  [16])
                              slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)local_460);
                  in_R8 = (SourceLocation)local_388;
                  pSVar12 = BumpAllocator::
                            emplace<slang::ast::StreamingConcatenationExpression,slang::ast::Type_const&,unsigned_long&,unsigned_int,std::span<slang::ast::StreamingConcatenationExpression::StreamExpression_const,18446744073709551615ul>,slang::SourceRange>
                                      (&comp->super_BumpAllocator,pTVar18,&local_458,&local_464,
                                       (span<const_slang::ast::StreamingConcatenationExpression::StreamExpression,_18446744073709551615UL>
                                        *)local_388,(SourceRange *)local_440);
                  local_428 = (StreamingConcatenationExpression *)
                              Expression::badExpr(comp,&pSVar12->super_Expression);
                  context = extraout_RDX_01;
                  goto LAB_0043a1fe;
                }
                local_358 = (AssertionInstanceDetails *)(local_450->streams_)._M_ptr;
                local_388 = *(undefined1 (*) [8])&local_450->super_Expression;
                _Stack_380._M_extent_value = (size_t)(local_450->super_Expression).type.ptr;
                local_378.m_bits = (underlying_type)(local_450->super_Expression).constant;
                pSStack_370 = (Symbol *)(local_450->super_Expression).syntax;
                local_368 = (local_450->super_Expression).sourceRange.startLoc;
                SStack_360 = (local_450->super_Expression).sourceRange.endLoc;
                local_350 = 0;
                local_34c = 0;
                uStack_344 = 0;
                local_33c = 0;
                local_338.data_ = (pointer)local_338.firstElement;
                local_338.len = 0;
                local_338.cap = 2;
                local_280 = local_268;
                local_278 = 0;
                local_270 = 5;
                local_240.data_ = (pointer)local_240.firstElement;
                local_240.len = 0;
                local_240.cap = 2;
                local_148.data_ = (pointer)local_148.firstElement;
                local_148.len = 0;
                local_148.cap = 2;
                local_40 = 0;
                local_50 = 0;
                uStack_48 = 0;
                SVar11 = (SourceLocation)local_388;
                oVar24 = Expression::evalSelector
                                   ((Expression *)local_430,(EvalContext *)local_388,false);
                if (((undefined1  [12])
                     oVar24.super__Optional_base<slang::ConstantRange,_true,_true>._M_payload.
                     super__Optional_payload_base<slang::ConstantRange> & (undefined1  [12])0x1) ==
                    (undefined1  [12])0x0) {
                  local_418 = '\0';
                  uStack_417 = 0;
                }
                else {
                  iVar10 = oVar24.super__Optional_base<slang::ConstantRange,_true,_true>._M_payload.
                           super__Optional_payload_base<slang::ConstantRange>._M_payload._0_4_;
                  iVar19 = oVar24.super__Optional_base<slang::ConstantRange,_true,_true>._M_payload.
                           super__Optional_payload_base<slang::ConstantRange>._M_payload._4_4_;
                  iVar9 = iVar10 - iVar19;
                  if (iVar10 - iVar19 == 0 || iVar10 < iVar19) {
                    iVar9 = -(iVar10 - iVar19);
                  }
                  local_41c = iVar9 + 1;
                  uStack_417 = oVar24.super__Optional_base<slang::ConstantRange,_true,_true>.
                               _M_payload.super__Optional_payload_base<slang::ConstantRange>.
                               _M_payload._1_7_ >> 0x20;
                  local_418 = '\x01';
                }
                SmallVectorBase<slang::Diagnostic>::cleanup(&local_148,(EVP_PKEY_CTX *)SVar11);
                SmallVectorBase<slang::Diagnostic>::cleanup(&local_240,(EVP_PKEY_CTX *)SVar11);
                if (local_280 != local_268) {
                  operator_delete(local_280);
                }
                SmallVectorBase<slang::ast::EvalContext::Frame>::cleanup
                          (&local_338,(EVP_PKEY_CTX *)SVar11);
                goto LAB_0043a22f;
              }
            }
          }
          ASTContext::addDiag((ASTContext *)local_450,(DiagCode)0x310007,
                              *(SourceRange *)&this_00->lastMember);
          pTVar18 = comp->errorType;
          local_464 = 0;
          local_388 = (undefined1  [8])0x0;
          _Stack_380._M_extent_value = 0;
          local_440 = (undefined1  [16])
                      slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)local_460);
          in_R8 = (SourceLocation)local_388;
          pSVar12 = BumpAllocator::
                    emplace<slang::ast::StreamingConcatenationExpression,slang::ast::Type_const&,unsigned_long&,unsigned_int,std::span<slang::ast::StreamingConcatenationExpression::StreamExpression_const,18446744073709551615ul>,slang::SourceRange>
                              (&comp->super_BumpAllocator,pTVar18,&local_458,&local_464,
                               (span<const_slang::ast::StreamingConcatenationExpression::StreamExpression,_18446744073709551615UL>
                                *)local_388,(SourceRange *)local_440);
          local_428 = (StreamingConcatenationExpression *)
                      Expression::badExpr(comp,&pSVar12->super_Expression);
          context = extraout_RDX_02;
          goto LAB_0043a1fe;
        }
        local_418 = '\0';
        uStack_417 = 0;
        local_430 = (Type *)0x0;
LAB_0043a22f:
        if (**(int **)(pSVar3 + 1) != 0x1bb) {
          if (pTVar18->canonical == (Type *)0x0) {
            Type::resolveCanonical(pTVar18);
          }
          if (((pTVar18->canonical->super_Symbol).kind == UnpackedUnionType) &&
             (bVar8 = Type::isTaggedUnion(pTVar18), !bVar8)) {
            if (pTVar18->canonical == (Type *)0x0) {
              Type::resolveCanonical(pTVar18);
            }
            pTVar14 = pTVar18->canonical;
            if (*(int *)&pTVar14[1].super_Symbol.nextInScope != 0) {
              Scope::elaborate((Scope *)(pTVar14 + 1));
            }
            SVar11 = pTVar14[1].super_Symbol.location;
            if (SVar11 != (SourceLocation)0x0) {
              pTVar18 = DeclaredType::getType((DeclaredType *)((long)SVar11 + 0x40));
            }
          }
          bVar8 = Type::isBitstreamType(pTVar18,(bool)((byte)(local_408 >> 0x14) & 1));
          if (bVar8) {
            SVar23.endLoc = in_R8;
            SVar23.startLoc = *(SourceLocation *)&this_00->deferredMemberIndex;
            bVar8 = Bitstream::checkClassAccess
                              ((Bitstream *)pTVar18,(Type *)local_450,
                               (ASTContext *)((SourceRange *)&this_00->lastMember)->startLoc,SVar23)
            ;
            if (bVar8) goto LAB_0043a23b;
            pTVar18 = comp->errorType;
            local_464 = 0;
            local_388 = (undefined1  [8])0x0;
            _Stack_380._M_extent_value = 0;
            local_440 = (undefined1  [16])
                        slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)local_460);
            in_R8 = (SourceLocation)local_388;
            pSVar12 = BumpAllocator::
                      emplace<slang::ast::StreamingConcatenationExpression,slang::ast::Type_const&,unsigned_long&,unsigned_int,std::span<slang::ast::StreamingConcatenationExpression::StreamExpression_const,18446744073709551615ul>,slang::SourceRange>
                                (&comp->super_BumpAllocator,pTVar18,&local_458,&local_464,
                                 (span<const_slang::ast::StreamingConcatenationExpression::StreamExpression,_18446744073709551615UL>
                                  *)local_388,(SourceRange *)local_440);
            local_428 = (StreamingConcatenationExpression *)
                        Expression::badExpr(comp,&pSVar12->super_Expression);
            context = extraout_RDX_03;
          }
          else {
            pDVar17 = ASTContext::addDiag((ASTContext *)local_450,(DiagCode)0x2b0007,
                                          *(SourceRange *)&this_00->lastMember);
            ast::operator<<(pDVar17,((not_null<const_slang::ast::Type_*> *)&this_00->thisSym)->ptr);
            pTVar18 = comp->errorType;
            local_464 = 0;
            local_388 = (undefined1  [8])0x0;
            _Stack_380._M_extent_value = 0;
            local_440 = (undefined1  [16])
                        slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)local_460);
            in_R8 = (SourceLocation)local_388;
            pSVar12 = BumpAllocator::
                      emplace<slang::ast::StreamingConcatenationExpression,slang::ast::Type_const&,unsigned_long&,unsigned_int,std::span<slang::ast::StreamingConcatenationExpression::StreamExpression_const,18446744073709551615ul>,slang::SourceRange>
                                (&comp->super_BumpAllocator,pTVar18,&local_458,&local_464,
                                 (span<const_slang::ast::StreamingConcatenationExpression::StreamExpression,_18446744073709551615UL>
                                  *)local_388,(SourceRange *)local_440);
            local_428 = (StreamingConcatenationExpression *)
                        Expression::badExpr(comp,&pSVar12->super_Expression);
            context = extraout_RDX_05;
          }
          goto LAB_0043a1fe;
        }
LAB_0043a23b:
        pTVar14 = local_430;
        if (*(ExpressionKind *)&this_00->compilation == Streaming) {
          pSVar16 = this_00[1].nameMap;
        }
        else if (local_430 == (Type *)0x0) {
          pSVar16 = (SymbolMap *)Type::getBitstreamWidth(pTVar18);
        }
        else if (local_418 == '\0') {
          pSVar16 = (SymbolMap *)0x0;
        }
        else {
          pTVar18 = Type::getArrayElementType(pTVar18);
          uVar15 = Type::getBitstreamWidth(pTVar18);
          auVar4._8_8_ = 0;
          auVar4._0_8_ = uVar15;
          pSVar16 = SUB168(auVar4 * ZEXT416(local_41c),0);
          pTVar14 = local_430;
          if ((SymbolMap *)0x3fffffff8 < pSVar16 || SUB168(auVar4 * ZEXT416(local_41c),8) != 0) {
            sourceRange.startLoc = (SourceLocation)(local_430->super_Symbol).parentScope;
            sourceRange.endLoc = (SourceLocation)(local_430->super_Symbol).nextInScope;
            ASTContext::addDiag((ASTContext *)local_450,(DiagCode)0x180009,sourceRange);
            pTVar18 = comp->errorType;
            local_464 = 0;
            local_388 = (undefined1  [8])0x0;
            _Stack_380._M_extent_value = 0;
            local_440 = (undefined1  [16])
                        slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)local_460);
            in_R8 = (SourceLocation)local_388;
            pSVar12 = BumpAllocator::
                      emplace<slang::ast::StreamingConcatenationExpression,slang::ast::Type_const&,unsigned_long&,unsigned_int,std::span<slang::ast::StreamingConcatenationExpression::StreamExpression_const,18446744073709551615ul>,slang::SourceRange>
                                (&comp->super_BumpAllocator,pTVar18,&local_458,&local_464,
                                 (span<const_slang::ast::StreamingConcatenationExpression::StreamExpression,_18446744073709551615UL>
                                  *)local_388,(SourceRange *)local_440);
            local_428 = (StreamingConcatenationExpression *)
                        Expression::badExpr(comp,&pSVar12->super_Expression);
            context = extraout_RDX_04;
            goto LAB_0043a1fe;
          }
        }
        local_410 = (long)&(pSVar16->table_).
                           super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_const_slang::ast::Symbol_*>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_const_slang::ast::Symbol_*>_>_>
                           .arrays.groups_size_index + local_410;
        if (0x3fffffff8 < local_410) {
          SVar23 = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)local_460);
          ASTContext::addDiag((ASTContext *)local_450,(DiagCode)0x180009,SVar23);
          pTVar18 = comp->errorType;
          local_464 = 0;
          local_388 = (undefined1  [8])0x0;
          _Stack_380._M_extent_value = 0;
          local_440 = (undefined1  [16])
                      slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)local_460);
          in_R8 = (SourceLocation)local_388;
          pSVar12 = BumpAllocator::
                    emplace<slang::ast::StreamingConcatenationExpression,slang::ast::Type_const&,unsigned_long&,unsigned_int,std::span<slang::ast::StreamingConcatenationExpression::StreamExpression_const,18446744073709551615ul>,slang::SourceRange>
                              (&comp->super_BumpAllocator,pTVar18,&local_458,&local_464,
                               (span<const_slang::ast::StreamingConcatenationExpression::StreamExpression,_18446744073709551615UL>
                                *)local_388,(SourceRange *)local_440);
          local_428 = (StreamingConcatenationExpression *)
                      Expression::badExpr(comp,&pSVar12->super_Expression);
          context = extraout_RDX_06;
          goto LAB_0043a1fe;
        }
        local_378.m_bits = (underlying_type)CONCAT14(local_418,local_41c);
        local_388 = (undefined1  [8])this_00;
        _Stack_380._M_extent_value = (size_t)pTVar14;
        SmallVectorBase<slang::ast::StreamingConcatenationExpression::StreamExpression>::
        emplace_back<slang::ast::StreamingConcatenationExpression::StreamExpression>
                  (local_400,(StreamExpression *)local_388);
        bVar8 = true;
        context = extraout_RDX_07;
      }
      bVar22 = local_441;
      if (!bVar8) break;
      lVar20 = lVar20 + 0x30;
      uVar21 = uVar21 - 1;
      bVar22 = uVar21 == 0;
    } while (!(bool)bVar22);
  }
  pSVar12 = local_428;
  if ((bVar22 & 1) != 0) {
    pTVar18 = comp->voidType;
    iVar9 = SmallVectorBase<slang::ast::StreamingConcatenationExpression::StreamExpression>::copy
                      (local_400,(EVP_PKEY_CTX *)comp,(EVP_PKEY_CTX *)context);
    local_388 = (undefined1  [8])CONCAT44(extraout_var_00,iVar9);
    _Stack_380._M_extent_value = (size_t)extraout_RDX_09;
    local_440 = (undefined1  [16])slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)local_460);
    pSVar12 = BumpAllocator::
              emplace<slang::ast::StreamingConcatenationExpression,slang::ast::Type_const&,unsigned_long&,unsigned_long&,std::span<slang::ast::StreamingConcatenationExpression::StreamExpression_const,18446744073709551615ul>,slang::SourceRange>
                        (&comp->super_BumpAllocator,pTVar18,&local_458,&local_410,
                         (span<const_slang::ast::StreamingConcatenationExpression::StreamExpression,_18446744073709551615UL>
                          *)local_388,(SourceRange *)local_440);
    if (((ulong)(local_450->super_Expression).constant & 0x80) == 0) {
      uVar21 = 0xffffff;
      if (local_410 < 0xffffff) {
        uVar21 = local_410;
      }
      pTVar18 = Compilation::getType
                          (comp,(bitwidth_t)uVar21,(bitmask<slang::ast::IntegralFlags>)0x2);
      assignmentRange.endLoc = (SourceLocation)0x0;
      assignmentRange.startLoc = (pSVar12->super_Expression).sourceRange.endLoc;
      pSVar12 = (StreamingConcatenationExpression *)
                Expression::convertAssignment
                          (&local_450->super_Expression,(ASTContext *)pTVar18,(Type *)pSVar12,
                           (Expression *)(pSVar12->super_Expression).sourceRange.startLoc,
                           assignmentRange,(Expression **)0x0,
                           (bitmask<slang::ast::AssignFlags> *)comp);
    }
  }
  if (local_400[0].data_ != (pointer)((long)local_400 + 0x18U)) {
    operator_delete(local_400[0].data_);
  }
  return &pSVar12->super_Expression;
}

Assistant:

Expression& StreamingConcatenationExpression::fromSyntax(
    Compilation& comp, const StreamingConcatenationExpressionSyntax& syntax,
    const ASTContext& context) {

    const bool isDestination = context.flags.has(ASTFlags::LValue);
    const bool isRightToLeft = syntax.operatorToken.kind == TokenKind::LeftShift;
    uint64_t sliceSize = 0;

    auto badResult = [&]() -> Expression& {
        return badExpr(comp, comp.emplace<StreamingConcatenationExpression>(
                                 comp.getErrorType(), sliceSize, 0u,
                                 std::span<const StreamExpression>(), syntax.sourceRange()));
    };

    if (!context.flags.has(ASTFlags::StreamingAllowed) &&
        (isDestination || !comp.hasFlag(CompilationFlags::AllowSelfDeterminedStreamConcat))) {
        context.addDiag(diag::BadStreamContext, syntax.operatorToken.location());
        return badResult();
    }

    if (syntax.sliceSize) {
        // The slice_size determines the size of each block. If specified, it may be a constant
        // integral expression or a simple type.
        auto& sliceExpr = bind(*syntax.sliceSize, context, ASTFlags::AllowDataType);
        if (sliceExpr.bad())
            return badResult();

        if (sliceExpr.kind == ExpressionKind::DataType) {
            if (!sliceExpr.type->isFixedSize()) {
                auto& diag = context.addDiag(diag::BadStreamSlice, sliceExpr.sourceRange);
                if (sliceExpr.type->location)
                    diag.addNote(diag::NoteDeclarationHere, sliceExpr.type->location);
                return badResult();
            }
            sliceSize = sliceExpr.type->getBitstreamWidth();
        }
        else {
            // It shall be an error for the value to be zero or negative.
            std::optional<int32_t> count = context.evalInteger(sliceExpr);
            if (!context.requireGtZero(count, sliceExpr.sourceRange))
                return badResult();
            sliceSize = static_cast<uint32_t>(*count);
        }

        if (!isRightToLeft) {
            // Left-to-right streaming using >> shall cause the slice_size to be ignored and no
            // re-ordering performed.
            sliceSize = 0;
            context.addDiag(diag::IgnoredSlice, syntax.sliceSize->sourceRange());
        }
    }
    else if (isRightToLeft) {
        // If a slice_size is not specified, the default is 1.
        sliceSize = 1;
    }

    uint64_t bitstreamWidth = 0;
    SmallVector<StreamExpression, 4> buffer;
    for (const auto argSyntax : syntax.expressions) {
        auto& arg = selfDetermined(comp, *argSyntax->expression, context,
                                   ASTFlags::StreamingAllowed);
        if (arg.bad())
            return badResult();

        const Type* argType = arg.type;
        const Expression* withExpr = nullptr;
        std::optional<bitwidth_t> constantWithWidth;
        if (argSyntax->withRange) {
            // The expression before the with can be any one-dimensional unpacked array
            // (including a queue).
            if (!argType->isUnpackedArray() || argType->isAssociativeArray() ||
                !argType->getArrayElementType()->isFixedSize()) {
                context.addDiag(diag::BadStreamWithType, arg.sourceRange);
                return badResult();
            }

            withExpr = &bindSelector(comp, arg, *argSyntax->withRange->range,
                                     context.resetFlags(ASTFlags::StreamingWithRange));
            if (withExpr->bad())
                return badResult();

            // Try to get the bounds of the selection, if they are constant.
            // If they are constant, we've already done bounds checking and
            // max size checking on them.
            EvalContext evalCtx(context);
            auto range = withExpr->evalSelector(evalCtx, /* enforceBounds */ false);
            if (range)
                constantWithWidth = range->width();
        }

        if (argSyntax->expression->kind != SyntaxKind::StreamingConcatenationExpression) {
            // Unpacked unions get "unwrapped" to their first member when streaming.
            if (argType->isUnpackedUnion() && !argType->isTaggedUnion()) {
                auto& uu = argType->getCanonicalType().as<UnpackedUnionType>();
                auto members = uu.members();
                if (members.begin() != members.end())
                    argType = &members.begin()->as<ValueSymbol>().getType();
            }

            if (!argType->isBitstreamType(isDestination)) {
                context.addDiag(diag::BadStreamExprType, arg.sourceRange) << *arg.type;
                return badResult();
            }

            if (!Bitstream::checkClassAccess(*argType, context, arg.sourceRange))
                return badResult();
        }

        uint64_t argWidth = 0;
        if (arg.kind == ExpressionKind::Streaming) {
            argWidth = arg.as<StreamingConcatenationExpression>().getBitstreamWidth();
        }
        else if (withExpr) {
            if (constantWithWidth) {
                auto rangeBits = checkedMulU64(argType->getArrayElementType()->getBitstreamWidth(),
                                               *constantWithWidth);
                if (!rangeBits || rangeBits > Type::MaxBitWidth) {
                    context.addDiag(diag::ObjectTooLarge, withExpr->sourceRange);
                    return badResult();
                }

                argWidth = *rangeBits;
            }
        }
        else {
            argWidth = argType->getBitstreamWidth();
        }

        bitstreamWidth += argWidth;
        if (bitstreamWidth > Type::MaxBitWidth) {
            context.addDiag(diag::ObjectTooLarge, syntax.sourceRange());
            return badResult();
        }

        buffer.push_back({&arg, withExpr, constantWithWidth});
    }

    // So normally the type of a streaming concatenation is never inspected,
    // since it can only be used in assignments and there is explicit handling
    // of these expressions there. We use a void type for the result to represent
    // this (also because otherwise what type can we use for e.g. non fixed-size
    // streams). However, in VCS compat mode the error about requiring an assignment
    // context can be silenced, so we need to come up with a real result type here,
    // which we do by converting to a packed bit vector of bitstream width.
    auto& result = *comp.emplace<StreamingConcatenationExpression>(
        comp.getVoidType(), sliceSize, bitstreamWidth, buffer.ccopy(comp), syntax.sourceRange());

    if (!context.flags.has(ASTFlags::StreamingAllowed)) {
        // Cap the width so we don't overflow. The conversion will error for us
        // since the target width will be less than the source width.
        auto width = std::min(bitstreamWidth, (uint64_t)SVInt::MAX_BITS);
        auto& type = comp.getType(bitwidth_t(width), IntegralFlags::FourState);
        return convertAssignment(context, type, result, result.sourceRange);
    }

    return result;
}